

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O1

void __thiscall
amrex::MLEBTensorOp::setBulkViscosity
          (MLEBTensorOp *this,int amrlev,Array<const_MultiFab_*,_3> *kappa)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    MultiFab::Copy((MultiFab *)
                   (*(long *)&(this->m_kappa).
                              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   + lVar1),kappa->_M_elems[0],0,0,1,0);
    lVar1 = lVar1 + 0x180;
    kappa = (Array<const_MultiFab_*,_3> *)((long)kappa + 8);
  } while (lVar1 != 0x480);
  (this->super_MLEBABecLap).field_0x3d5 = 1;
  return;
}

Assistant:

void
MLEBTensorOp::setBulkViscosity (int amrlev, const Array<MultiFab const*,AMREX_SPACEDIM>& kappa)
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        MultiFab::Copy(m_kappa[amrlev][0][idim], *kappa[idim], 0, 0, 1, 0);
    }
    m_has_kappa = true;
}